

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O0

void __thiscall
icu_63::DayPeriodRulesCountSink::DayPeriodRulesCountSink(DayPeriodRulesCountSink *this)

{
  DayPeriodRulesCountSink *this_local;
  
  ResourceSink::ResourceSink(&this->super_ResourceSink);
  (this->super_ResourceSink).super_UObject._vptr_UObject =
       (_func_int **)&PTR__DayPeriodRulesCountSink_005bcef8;
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool, UErrorCode &errorCode) {
        ResourceTable rules = value.getTable(errorCode);
        if (U_FAILURE(errorCode)) { return; }

        for (int32_t i = 0; rules.getKeyAndValue(i, key, value); ++i) {
            int32_t setNum = DayPeriodRulesDataSink::parseSetNum(key, errorCode);
            if (setNum > data->maxRuleSetNum) {
                data->maxRuleSetNum = setNum;
            }
        }
    }